

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O2

void __thiscall
Deque<int,_std::allocator<int>_>::big_overtake(Deque<int,_std::allocator<int>_> *this)

{
  size_t sVar1;
  DataBlock **ppDVar2;
  ulong uVar3;
  long lVar4;
  
  sVar1 = (this->big_).size_;
  if (sVar1 == (this->current_).size_) {
    return;
  }
  ppDVar2 = (this->current_).begin_;
  uVar3 = (this->current_).allocSize_;
  lVar4 = 0;
  if (uVar3 <= (ulong)((long)((long)ppDVar2 + (sVar1 * 8 - (long)(this->current_).arr_)) >> 3)) {
    lVar4 = -uVar3;
  }
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::push_back(&this->big_,ppDVar2 + sVar1 + lVar4);
  return;
}

Assistant:

std::size_t size() const {
        return size_;
    }